

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::SumSquares1DTest_ExtremeValues_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::SumSquares1DTest_ExtremeValues_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_unsigned_int)>_>::
  SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x38);
  anon_unknown.dwarf_149ae79::SumSquares1DTest_ExtremeValues_Test::
  SumSquares1DTest_ExtremeValues_Test((SumSquares1DTest_ExtremeValues_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }